

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void anon_unknown.dwarf_12cd89b::sync(void)

{
  vector<bool,_std::allocator<bool>_> *this;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  int iVar1;
  int iVar2;
  
  *in_RDI = 0x100000001;
  this = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 1);
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[8] = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  in_RDI[10] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  std::vector<bool,_std::allocator<bool>_>::reserve(this,(long)(in_EDX * in_ESI));
  if (in_ESI != 0) {
    do {
      in_ESI = in_ESI + -1;
      iVar1 = -9;
      while (iVar1 = iVar1 + 1, iVar2 = in_EDX + -7, iVar1 != 0) {
        std::vector<bool,_std::allocator<bool>_>::push_back(this,true);
      }
      while (iVar2 + -1 != 0) {
        std::vector<bool,_std::allocator<bool>_>::push_back(this,false);
        iVar2 = iVar2 + -1;
      }
    } while (in_ESI != 0);
  }
  return;
}

Assistant:

Storage::Disk::PCMSegment sync(int length, int bit_size) {
	Storage::Disk::PCMSegment segment;

	// Reserve sufficient storage.
	segment.data.reserve(size_t(length * bit_size));

	// Write patterns of 0xff padded with 0s to the selected bit size.
	while(length--) {
		int c = 8;
		while(c--)
			segment.data.push_back(true);

		c = bit_size - 8;
		while(c--)
			segment.data.push_back(false);
	}

	return segment;
}